

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O0

int mixed_register_segment
              (char *name,uint32_t argc,mixed_segment_field_info *args,
              mixed_make_segment_function function)

{
  segment_entry *psVar1;
  int iVar2;
  size_t sVar3;
  segment_entry *cur_entry;
  uint32_t i;
  uint32_t name_length;
  segment_entry *entry;
  mixed_make_segment_function function_local;
  mixed_segment_field_info *args_local;
  uint32_t argc_local;
  char *name_local;
  
  _i = (segment_entry *)0x0;
  if (argc < 0x21) {
    sVar3 = strlen(name);
    if ((uint)sVar3 < 0x41) {
      if (segments.count < 0x400) {
        for (cur_entry._0_4_ = 0; (uint)cur_entry < segments.count;
            cur_entry._0_4_ = (uint)cur_entry + 1) {
          if (((_i != (segment_entry *)0x0) ||
              (psVar1 = segments.entries + (uint)cur_entry,
              segments.entries[(uint)cur_entry].function != (mixed_make_segment_function)0x0)) &&
             (iVar2 = strcmp(segments.entries[(uint)cur_entry].name,name), psVar1 = _i, iVar2 == 0))
          {
            mixed_err(0x17);
            return 0;
          }
          _i = psVar1;
        }
        if (_i == (segment_entry *)0x0) {
          _i = segments.entries + segments.count;
        }
        memcpy(_i,name,sVar3 & 0xffffffff);
        _i->argc = argc;
        memcpy(_i->args,args,(ulong)argc << 5);
        _i->function = function;
        segments.count = segments.count + 1;
        name_local._4_4_ = 1;
      }
      else {
        mixed_err(1);
        name_local._4_4_ = 0;
      }
    }
    else {
      mixed_err(0x1a);
      name_local._4_4_ = 0;
    }
  }
  else {
    mixed_err(0x19);
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_register_segment(const char *name, uint32_t argc, struct mixed_segment_field_info *args, mixed_make_segment_function function){
  struct segment_entry *entry = 0;

  if(MIXED_MAX_MAKE_ARG_COUNT < argc){
    mixed_err(MIXED_BAD_ARGUMENT_COUNT);
    return 0;
  }

  uint32_t name_length = strlen(name);
  if(MIXED_MAX_SEGMENT_NAME_LENGTH < name_length){
    mixed_err(MIXED_BAD_NAME);
    return 0;
  }

  if(MIXED_MAX_SEGMENT_COUNT <= segments.count){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  for(uint32_t i=0; i<segments.count; ++i){
    struct segment_entry *cur_entry = &segments.entries[i];
    if(!entry && !cur_entry->function){
      entry = cur_entry;
    }else if(strcmp(cur_entry->name, name) == 0){
      mixed_err(MIXED_DUPLICATE_SEGMENT);
      return 0;
    }
  }

  if(!entry){
    entry = &segments.entries[segments.count];
  }

  memcpy(entry->name, name, name_length);
  entry->argc = argc;
  memcpy(entry->args, args, argc*sizeof(struct mixed_segment_field_info));
  entry->function = function;
  segments.count++;

  return 1;
}